

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::value_and_holder::set_instance_registered(value_and_holder *this,bool v)

{
  uint8_t *puVar1;
  bool v_local;
  value_and_holder *this_local;
  
  if (((byte)this->inst->field_0x30 >> 1 & 1) == 0) {
    if (v) {
      puVar1 = (this->inst->field_1).nonsimple.status;
      puVar1[this->index] = puVar1[this->index] | 2;
    }
    else {
      puVar1 = (this->inst->field_1).nonsimple.status;
      puVar1[this->index] = puVar1[this->index] & 0xfd;
    }
  }
  else {
    this->inst->field_0x30 = this->inst->field_0x30 & 0xf7 | v << 3;
  }
  return;
}

Assistant:

void set_instance_registered(bool v = true) {
        if (inst->simple_layout) {
            inst->simple_instance_registered = v;
        } else if (v) {
            inst->nonsimple.status[index] |= instance::status_instance_registered;
        } else {
            inst->nonsimple.status[index] &= (std::uint8_t) ~instance::status_instance_registered;
        }
    }